

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2mem.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char *__filename;
  FILE *__stream;
  uint uVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  long *plVar6;
  FILE *pFVar7;
  size_t sVar8;
  FILE *pFVar9;
  long *plVar10;
  ulong uVar11;
  int iVar12;
  char *__s;
  char *pcVar13;
  string *name;
  long lVar14;
  bool bVar15;
  bool bVar16;
  int EOP;
  int top_count;
  int bottom_count;
  int blob_index;
  int layer_count;
  int blob_count;
  int v;
  int typeindex;
  int magic;
  string parambinpath;
  int id;
  string include_guard_var;
  string param_var;
  char layer_type [33];
  char bottom_name [257];
  char layer_name [257];
  int local_34c;
  FILE *local_348;
  int local_340;
  int local_33c;
  int local_338;
  uint local_334;
  int local_330;
  int local_32c;
  FILE *local_328;
  undefined1 local_31c [4];
  int local_318 [2];
  char *local_310;
  ulong local_308;
  long *local_300;
  long local_2f8;
  long local_2f0;
  long lStack_2e8;
  long *local_2e0 [2];
  long local_2d0 [2];
  char *local_2c0;
  string local_2b8;
  string local_298;
  string local_278;
  string local_248 [8];
  string local_138 [8];
  
  if (argc != 5) {
    main_cold_1();
    return -1;
  }
  pcVar13 = argv[1];
  pcVar1 = argv[2];
  __filename = argv[3];
  local_310 = argv[4];
  pcVar5 = strrchr(pcVar13,0x2f);
  __s = pcVar5 + 1;
  if (pcVar5 == (char *)0x0) {
    __s = pcVar13;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_138,__s,(allocator<char> *)local_248);
  plVar6 = (long *)std::__cxx11::string::append((char *)local_138);
  local_300 = &local_2f0;
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_2f0 = *plVar10;
    lStack_2e8 = plVar6[3];
  }
  else {
    local_2f0 = *plVar10;
    local_300 = (long *)*plVar6;
  }
  local_2f8 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_2c0 = pcVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
    operator_delete(local_138[0]._M_dataplus._M_p,local_138[0].field_2._M_allocated_capacity + 1);
  }
  plVar6 = local_300;
  pFVar7 = fopen(pcVar13,"rb");
  if (pFVar7 == (FILE *)0x0) {
    fprintf(_stderr,"fopen %s failed\n",pcVar13);
    goto LAB_0011234d;
  }
  local_348 = fopen((char *)plVar6,"wb");
  local_328 = fopen(__filename,"wb");
  path_to_varname_abi_cxx11_(&local_298,pcVar13);
  path_to_varname_abi_cxx11_(&local_2b8,__filename);
  pFVar9 = local_328;
  fprintf(local_328,"#ifndef NCNN_INCLUDE_GUARD_%s\n",local_2b8._M_dataplus._M_p);
  fprintf(pFVar9,"#define NCNN_INCLUDE_GUARD_%s\n",local_2b8._M_dataplus._M_p);
  fprintf(pFVar9,"namespace %s_id {\n",local_298._M_dataplus._M_p);
  local_318[1] = 0;
  uVar2 = __isoc99_fscanf(pFVar7,"%d");
  if (uVar2 == 1) {
    fwrite(local_318 + 1,4,1,local_348);
    local_330 = 0;
    local_32c = 0;
    uVar2 = __isoc99_fscanf(pFVar7,"%d %d");
    if (uVar2 != 2) {
      pcVar13 = "read layer_count and blob_count failed %d\n";
      goto LAB_0011269f;
    }
    fwrite(&local_330,4,1,local_348);
    fwrite(&local_32c,4,1,local_348);
    pFVar9 = local_348;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&layer_names_abi_cxx11_,(long)local_330);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&blob_names_abi_cxx11_,(long)local_32c);
    local_334 = 0;
    if (local_330 < 1) {
LAB_001122bc:
      __stream = local_328;
      fprintf(local_328,"} // namespace %s_id\n",local_298._M_dataplus._M_p);
      fprintf(__stream,"#endif // NCNN_INCLUDE_GUARD_%s\n",local_2b8._M_dataplus._M_p);
      fclose(pFVar7);
      fclose(pFVar9);
      fclose(__stream);
    }
    else {
      uVar11 = 0;
      do {
        name = local_138;
        local_338 = 0;
        local_33c = 0;
        uVar2 = __isoc99_fscanf(pFVar7,"%32s %256s %d %d",&local_278,name,&local_338,&local_33c);
        if (uVar2 == 4) {
          sanitize_name((char *)name);
          local_318[0] = ncnn::layer_to_index((char *)&local_278);
          fwrite(local_318,4,1,pFVar9);
          fwrite(&local_338,4,1,pFVar9);
          fwrite(&local_33c,4,1,pFVar9);
          local_308 = uVar11;
          fprintf(local_328,"const int LAYER_%s = %d;\n",name,uVar11 & 0xffffffff);
          bVar16 = 0 < local_338;
          local_340 = 5;
          if (0 < local_338) {
            iVar12 = 0;
            do {
              uVar2 = __isoc99_fscanf(pFVar7,"%256s",local_248);
              if (uVar2 == 1) {
                sanitize_name((char *)local_248);
                bVar15 = blob_names_abi_cxx11_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish !=
                         blob_names_abi_cxx11_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (bVar15) {
                  iVar3 = std::__cxx11::string::compare
                                    ((char *)blob_names_abi_cxx11_.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                  if (iVar3 == 0) {
                    name = (string *)0x0;
                  }
                  else {
                    lVar14 = 0x20;
                    name = (string *)0x0;
                    do {
                      name = (string *)((long)&(name->_M_dataplus)._M_p + 1);
                      bVar15 = name < (string *)
                                      ((long)blob_names_abi_cxx11_.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)blob_names_abi_cxx11_.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 5);
                      if (!bVar15) goto LAB_00111dae;
                      iVar3 = std::__cxx11::string::compare
                                        ((char *)((long)&((blob_names_abi_cxx11_.
                                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar14));
                      lVar14 = lVar14 + 0x20;
                    } while (iVar3 != 0);
                  }
                  bVar15 = true;
                }
LAB_00111dae:
                if (!bVar15) {
                  fprintf(_stderr,"find_blob_index_by_name %s failed\n",local_248);
                  name = (string *)0xffffffff;
                }
                local_2e0[0] = (long *)CONCAT44(local_2e0[0]._4_4_,(int)name);
                fwrite(local_2e0,4,1,local_348);
              }
              else {
                fprintf(_stderr,"read bottom_name failed %d\n",(ulong)uVar2);
              }
              pFVar9 = local_348;
              if (uVar2 != 1) {
                local_340 = 1;
                break;
              }
              iVar12 = iVar12 + 1;
              bVar16 = iVar12 < local_338;
            } while (iVar12 < local_338);
          }
          uVar11 = local_308;
          iVar12 = local_340;
          iVar3 = local_340;
          if (!bVar16) {
            bVar16 = 0 < local_33c;
            local_340 = 8;
            if (0 < local_33c) {
              iVar12 = 0;
              do {
                uVar2 = __isoc99_fscanf(pFVar7,"%256s",local_248);
                if (uVar2 == 1) {
                  sanitize_name((char *)local_248);
                  local_2e0[0] = local_2d0;
                  sVar8 = strlen((char *)local_248);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_2e0,local_248,
                             (long)&local_248[0]._M_dataplus._M_p + sVar8);
                  uVar4 = local_334;
                  std::__cxx11::string::operator=
                            ((string *)
                             (blob_names_abi_cxx11_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + (int)local_334),
                             (string *)local_2e0);
                  if (local_2e0[0] != local_2d0) {
                    operator_delete(local_2e0[0],local_2d0[0] + 1);
                  }
                  fprintf(local_328,"const int BLOB_%s = %d;\n",local_248,(ulong)uVar4);
                  pFVar9 = local_348;
                  fwrite(&local_334,4,1,local_348);
                  local_334 = local_334 + 1;
                }
                else {
                  fprintf(_stderr,"read blob_name failed %d\n",(ulong)uVar2);
                  pFVar9 = local_348;
                }
                if (uVar2 != 1) {
                  local_340 = 1;
                  break;
                }
                iVar12 = iVar12 + 1;
                bVar16 = iVar12 < local_33c;
              } while (iVar12 < local_33c);
            }
            uVar11 = local_308;
            iVar12 = local_340;
            iVar3 = local_340;
            if (!bVar16) {
              local_2e0[0] = (long *)((ulong)local_2e0[0] & 0xffffffff00000000);
              do {
                iVar12 = __isoc99_fscanf(pFVar7,"%d=",local_2e0);
                if (iVar12 != 1) {
                  local_34c = -0xe9;
                  fwrite(&local_34c,4,1,pFVar9);
                  local_248[0]._M_dataplus._M_p = (pointer)&local_248[0].field_2;
                  sVar8 = strlen((char *)local_138);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_248,local_138,
                             (long)&local_138[0]._M_dataplus._M_p + sVar8);
                  std::__cxx11::string::operator=
                            ((string *)
                             (layer_names_abi_cxx11_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + local_308),
                             (string *)local_248);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_248[0]._M_dataplus._M_p != &local_248[0].field_2) {
                    operator_delete(local_248[0]._M_dataplus._M_p,
                                    local_248[0].field_2._M_allocated_capacity + 1);
                  }
                  iVar12 = 0;
                  uVar11 = local_308;
                  iVar3 = iVar12;
                  break;
                }
                fwrite(local_2e0,4,1,pFVar9);
                if ((int)local_2e0[0] < -0x5b03) {
                  local_34c = 0;
                  uVar2 = __isoc99_fscanf(pFVar7,"%d",&local_34c);
                  if (uVar2 == 1) {
                    fwrite(&local_34c,4,1,pFVar9);
                    if (local_34c < 1) {
                      iVar12 = 0;
                      bVar16 = true;
                    }
                    else {
                      iVar12 = 0;
                      do {
                        uVar2 = __isoc99_fscanf(pFVar7,",%15[^,\n ]",local_248);
                        bVar16 = uVar2 == 1;
                        if (bVar16) {
                          bVar15 = vstr_is_float((char *)local_248);
                          if (bVar15) {
                            pcVar13 = "%f";
                          }
                          else {
                            pcVar13 = "%d";
                          }
                          __isoc99_sscanf(local_248,pcVar13,local_31c);
                          fwrite(local_31c,4,1,local_348);
                        }
                        else {
                          fprintf(_stderr,"read array element failed %d\n",(ulong)uVar2);
                        }
                        if (uVar2 != 1) {
                          iVar12 = 1;
                          goto LAB_00112192;
                        }
                        iVar12 = iVar12 + 1;
                      } while (iVar12 < local_34c);
                      iVar12 = 0;
                      bVar16 = true;
                    }
                  }
                  else {
                    fprintf(_stderr,"read array length failed %d\n",(ulong)uVar2);
                    iVar12 = 1;
                    bVar16 = false;
                  }
LAB_00112192:
                  pFVar9 = local_348;
                  if (bVar16) {
LAB_0011216b:
                    iVar12 = 0;
                  }
                }
                else {
                  uVar2 = __isoc99_fscanf(pFVar7,"%15s",local_248);
                  if (uVar2 == 1) {
                    bVar16 = vstr_is_float((char *)local_248);
                    if (bVar16) {
                      pcVar13 = "%f";
                    }
                    else {
                      pcVar13 = "%d";
                    }
                    __isoc99_sscanf(local_248,pcVar13,&local_34c);
                    fwrite(&local_34c,4,1,pFVar9);
                  }
                  else {
                    fprintf(_stderr,"read value failed %d\n",(ulong)uVar2);
                  }
                  iVar12 = 1;
                  if (uVar2 == 1) goto LAB_0011216b;
                }
                uVar11 = local_308;
                iVar3 = iVar12;
              } while (iVar12 == 0);
            }
          }
        }
        else {
          fprintf(_stderr,"read layer params failed %d\n",(ulong)uVar2);
          iVar12 = 1;
          iVar3 = local_340;
        }
        local_340 = iVar3;
        if (iVar12 != 0) goto LAB_001122b7;
        uVar11 = uVar11 + 1;
      } while ((long)uVar11 < (long)local_330);
      iVar12 = 2;
LAB_001122b7:
      if (iVar12 == 2) goto LAB_001122bc;
    }
  }
  else {
    pcVar13 = "read magic failed %d\n";
LAB_0011269f:
    fprintf(_stderr,pcVar13,(ulong)uVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
LAB_0011234d:
  plVar6 = local_300;
  pFVar7 = fopen(local_310,"wb");
  path_to_varname_abi_cxx11_(local_138,(char *)plVar6);
  path_to_varname_abi_cxx11_(local_248,local_310);
  pFVar9 = fopen((char *)plVar6,"rb");
  if (pFVar9 == (FILE *)0x0) {
    fprintf(_stderr,"fopen %s failed\n",plVar6);
  }
  else {
    fprintf(pFVar7,"#ifndef NCNN_INCLUDE_GUARD_%s\n",local_248[0]._M_dataplus._M_p);
    fprintf(pFVar7,"#define NCNN_INCLUDE_GUARD_%s\n",local_248[0]._M_dataplus._M_p);
    fwrite("\n#ifdef _MSC_VER\n__declspec(align(4))\n#else\n__attribute__((aligned(4)))\n#endif\n",
           0x4f,1,pFVar7);
    fprintf(pFVar7,"static const unsigned char %s[] = {\n",local_138[0]._M_dataplus._M_p);
    uVar2 = 0;
    do {
      iVar12 = feof(pFVar9);
      if (iVar12 != 0) break;
      uVar4 = fgetc(pFVar9);
      if (uVar4 != 0xffffffff) {
        fprintf(pFVar7,"0x%02x,",(ulong)uVar4);
        uVar2 = uVar2 + 1;
        if ((uVar2 & 0xf) == 0) {
          fputc(10,pFVar7);
        }
      }
    } while (uVar4 != 0xffffffff);
    fwrite("};\n",3,1,pFVar7);
    fclose(pFVar9);
    pcVar13 = local_2c0;
    path_to_varname_abi_cxx11_(&local_278,local_2c0);
    pFVar9 = fopen(pcVar13,"rb");
    if (pFVar9 == (FILE *)0x0) {
      fprintf(_stderr,"fopen %s failed\n",pcVar13);
    }
    else {
      fwrite("\n#ifdef _MSC_VER\n__declspec(align(4))\n#else\n__attribute__((aligned(4)))\n#endif\n"
             ,0x4f,1,pFVar7);
      fprintf(pFVar7,"static const unsigned char %s[] = {\n",local_278._M_dataplus._M_p);
      uVar2 = 0;
      do {
        iVar12 = feof(pFVar9);
        if (iVar12 != 0) break;
        uVar4 = fgetc(pFVar9);
        if (uVar4 != 0xffffffff) {
          fprintf(pFVar7,"0x%02x,",(ulong)uVar4);
          uVar2 = uVar2 + 1;
          if ((uVar2 & 0xf) == 0) {
            fputc(10,pFVar7);
          }
        }
      } while (uVar4 != 0xffffffff);
      fwrite("};\n",3,1,pFVar7);
      fprintf(pFVar7,"#endif // NCNN_INCLUDE_GUARD_%s\n",local_248[0]._M_dataplus._M_p);
      fclose(pFVar9);
      fclose(pFVar7);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248[0]._M_dataplus._M_p != &local_248[0].field_2) {
    operator_delete(local_248[0]._M_dataplus._M_p,local_248[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
    operator_delete(local_138[0]._M_dataplus._M_p,local_138[0].field_2._M_allocated_capacity + 1);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300,local_2f0 + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 5)
    {
        fprintf(stderr, "Usage: %s [ncnnproto] [ncnnbin] [idcpppath] [memcpppath]\n", argv[0]);
        return -1;
    }

    const char* parampath = argv[1];
    const char* modelpath = argv[2];
    const char* idcpppath = argv[3];
    const char* memcpppath = argv[4];

    const char* lastslash = strrchr(parampath, '/');
    const char* name = lastslash == NULL ? parampath : lastslash + 1;

    std::string parambinpath = std::string(name) + ".bin";

    dump_param(parampath, parambinpath.c_str(), idcpppath);

    write_memcpp(parambinpath.c_str(), modelpath, memcpppath);

    return 0;
}